

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

bool __thiscall
Kernel::InferenceStore::Smt2ProofCheckPrinter::hideProofStep
          (Smt2ProofCheckPrinter *this,InferenceRule rule)

{
  InferenceRule rule_local;
  Smt2ProofCheckPrinter *this_local;
  bool local_1;
  
  if ((((((byte)(rule + FOOL_ELIMINATION) < 3) || ((byte)(rule + INEQUALITY_SPLITTING) < 2)) ||
       (rule == CHOICE_AXIOM)) ||
      ((((rule == INPUT || (rule == NEGATED_CONJECTURE)) ||
        ((rule == RECTIFY || (((byte)(rule - FLATTEN) < 3 || ((byte)(rule - SKOLEMIZE) < 2)))))) ||
       ((byte)(rule + CHOICE_AXIOM) < 3)))) ||
     (((rule == PREDICATE_DEFINITION || ((byte)(rule + AVATAR_SPLIT_CLAUSE) < 2)) ||
      ((byte)(rule + AVATAR_COMPONENT) < 4)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool hideProofStep(InferenceRule rule)
  {
    switch(rule) {
    case InferenceRule::INPUT:
    case InferenceRule::INEQUALITY_SPLITTING_NAME_INTRODUCTION:
    case InferenceRule::INEQUALITY_SPLITTING:
    case InferenceRule::SKOLEMIZE:
    case InferenceRule::EQUALITY_PROXY_REPLACEMENT:
    case InferenceRule::EQUALITY_PROXY_AXIOM1:
    case InferenceRule::EQUALITY_PROXY_AXIOM2:
    case InferenceRule::NEGATED_CONJECTURE:
    case InferenceRule::RECTIFY:
    case InferenceRule::FLATTEN:
    case InferenceRule::ENNF:
    case InferenceRule::NNF:
    case InferenceRule::CLAUSIFY:
    case InferenceRule::AVATAR_DEFINITION:
    case InferenceRule::AVATAR_COMPONENT:
    case InferenceRule::AVATAR_REFUTATION:
    case InferenceRule::AVATAR_SPLIT_CLAUSE:
    case InferenceRule::AVATAR_CONTRADICTION_CLAUSE:
    case InferenceRule::FOOL_LET_DEFINITION:
    case InferenceRule::FOOL_ITE_DEFINITION:
    case InferenceRule::FOOL_ELIMINATION:
    case InferenceRule::BOOLEAN_TERM_ENCODING:
    case InferenceRule::CHOICE_AXIOM:
    case InferenceRule::PREDICATE_DEFINITION:
      return true;
    default:
      return false;
    }
  }